

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-ref.c
# Opt level: O1

int run_test_tcp_ref2(void)

{
  int iVar1;
  int extraout_EAX;
  undefined8 uVar2;
  undefined8 uVar3;
  int64_t eval_b;
  int64_t eval_a;
  uv_tcp_t h;
  undefined1 auStack_1d8 [216];
  code *pcStack_100;
  long local_f0;
  long local_e8;
  undefined1 local_e0 [216];
  
  pcStack_100 = (code *)0x1b9217;
  uVar2 = uv_default_loop();
  pcStack_100 = (code *)0x1b9227;
  uv_tcp_init(uVar2,local_e0);
  pcStack_100 = (code *)0x1b923b;
  uv_listen(local_e0,0x80,fail_cb);
  pcStack_100 = (code *)0x1b9243;
  uv_unref(local_e0);
  pcStack_100 = (code *)0x1b9248;
  uVar2 = uv_default_loop();
  pcStack_100 = (code *)0x1b9252;
  uv_run(uVar2,0);
  pcStack_100 = (code *)0x1b925a;
  do_close(local_e0);
  pcStack_100 = (code *)0x1b925f;
  uVar2 = uv_default_loop();
  pcStack_100 = (code *)0x1b9273;
  uv_walk(uVar2,close_walk_cb,0);
  pcStack_100 = (code *)0x1b927d;
  uv_run(uVar2,0);
  local_e8 = 0;
  pcStack_100 = (code *)0x1b928b;
  uVar3 = uv_default_loop();
  pcStack_100 = (code *)0x1b9293;
  iVar1 = uv_loop_close(uVar3);
  local_f0 = (long)iVar1;
  if (local_e8 == local_f0) {
    pcStack_100 = (code *)0x1b92ab;
    uv_library_shutdown();
    return 0;
  }
  pcStack_100 = run_test_tcp_ref2b;
  run_test_tcp_ref2_cold_1();
  pcStack_100 = (code *)uVar2;
  uVar2 = uv_default_loop();
  uv_tcp_init(uVar2,auStack_1d8);
  uv_listen(auStack_1d8,0x80,fail_cb);
  uv_unref(auStack_1d8);
  uv_close(auStack_1d8,close_cb);
  uVar2 = uv_default_loop();
  uv_run(uVar2,0);
  if (close_cb_called == 1) {
    uVar2 = uv_default_loop();
    uv_walk(uVar2,close_walk_cb,0);
    uv_run(uVar2,0);
    uVar2 = uv_default_loop();
    iVar1 = uv_loop_close(uVar2);
    if (iVar1 == 0) {
      uv_library_shutdown();
      return 0;
    }
  }
  else {
    run_test_tcp_ref2b_cold_1();
  }
  run_test_tcp_ref2b_cold_2();
  close_cb_called = close_cb_called + 1;
  return extraout_EAX;
}

Assistant:

TEST_IMPL(tcp_ref2) {
  uv_tcp_t h;
  uv_tcp_init(uv_default_loop(), &h);
  uv_listen((uv_stream_t*)&h, 128, (uv_connection_cb)fail_cb);
  uv_unref((uv_handle_t*)&h);
  uv_run(uv_default_loop(), UV_RUN_DEFAULT);
  do_close(&h);
  MAKE_VALGRIND_HAPPY(uv_default_loop());
  return 0;
}